

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_dirhie.c
# Opt level: O1

CURLcode create_dir_hierarchy(char *outfile,FILE *errors)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  char *__s_00;
  char *__src;
  char *pcVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  char *pcVar8;
  CURLcode local_44;
  
  sVar3 = strlen(outfile);
  __s = strdup(outfile);
  if (__s == (char *)0x0) {
    local_44 = CURLE_OUT_OF_MEMORY;
  }
  else {
    __s_00 = (char *)malloc(sVar3 + 1);
    if (__s_00 == (char *)0x0) {
      local_44 = CURLE_OUT_OF_MEMORY;
    }
    else {
      *__s_00 = '\0';
      __src = strtok(__s,"/");
      local_44 = CURLE_OK;
      do {
        if (__src == (char *)0x0) break;
        pcVar4 = strtok((char *)0x0,"/");
        if (pcVar4 == (char *)0x0) {
          bVar1 = true;
          __src = pcVar4;
        }
        else {
          sVar5 = strlen(__s_00);
          if (sVar5 == 0) {
            sVar7 = sVar3;
            pcVar8 = __s_00;
            if (__s != __src) goto LAB_0010c492;
            strcpy(__s_00,__src);
          }
          else {
            sVar7 = sVar3 - sVar5;
            pcVar8 = __s_00 + sVar5;
LAB_0010c492:
            curl_msnprintf(pcVar8,sVar7,"%s%s","/",__src);
          }
          iVar2 = mkdir(__s_00,0x1e8);
          bVar1 = true;
          if (iVar2 == -1) {
            piVar6 = __errno_location();
            iVar2 = *piVar6;
            if (iVar2 < 0x1e) {
              if ((iVar2 == 0xd) || (iVar2 == 0x11)) goto LAB_0010c533;
              if (iVar2 == 0x1c) {
                pcVar8 = "No space left on the file system that will contain the directory %s.\n";
              }
              else {
LAB_0010c513:
                pcVar8 = "Error creating directory %s.\n";
              }
            }
            else if (iVar2 == 0x7a) {
              pcVar8 = "Cannot create directory %s because you exceeded your quota.\n";
            }
            else {
              pcVar8 = "The directory name %s is too long.\n";
              if (iVar2 != 0x24) {
                if (iVar2 != 0x1e) goto LAB_0010c513;
                pcVar8 = "%s resides on a read-only file system.\n";
              }
            }
            bVar1 = false;
            curl_mfprintf(errors,pcVar8,__s_00);
            local_44 = CURLE_WRITE_ERROR;
          }
LAB_0010c533:
          if (bVar1) {
            __src = pcVar4;
          }
        }
      } while (bVar1);
      free(__s_00);
    }
    free(__s);
  }
  return local_44;
}

Assistant:

CURLcode create_dir_hierarchy(const char *outfile, FILE *errors)
{
  char *tempdir;
  char *tempdir2;
  char *outdup;
  char *dirbuildup;
  CURLcode result = CURLE_OK;
  size_t outlen;

  outlen = strlen(outfile);
  outdup = strdup(outfile);
  if(!outdup)
    return CURLE_OUT_OF_MEMORY;

  dirbuildup = malloc(outlen + 1);
  if(!dirbuildup) {
    Curl_safefree(outdup);
    return CURLE_OUT_OF_MEMORY;
  }
  dirbuildup[0] = '\0';

  /* Allow strtok() here since this isn't used threaded */
  /* !checksrc! disable BANNEDFUNC 2 */
  tempdir = strtok(outdup, PATH_DELIMITERS);

  while(tempdir != NULL) {
    bool skip = false;
    tempdir2 = strtok(NULL, PATH_DELIMITERS);
    /* since strtok returns a token for the last word even
       if not ending with DIR_CHAR, we need to prune it */
    if(tempdir2 != NULL) {
      size_t dlen = strlen(dirbuildup);
      if(dlen)
        msnprintf(&dirbuildup[dlen], outlen - dlen, "%s%s", DIR_CHAR, tempdir);
      else {
        if(outdup == tempdir) {
#if defined(MSDOS) || defined(WIN32)
          /* Skip creating a drive's current directory.
             It may seem as though that would harmlessly fail but it could be
             a corner case if X: did not exist, since we would be creating it
             erroneously.
             eg if outfile is X:\foo\bar\filename then don't mkdir X:
             This logic takes into account unsupported drives !:, 1:, etc. */
          char *p = strchr(tempdir, ':');
          if(p && !p[1])
            skip = true;
#endif
          /* the output string doesn't start with a separator */
          strcpy(dirbuildup, tempdir);
        }
        else
          msnprintf(dirbuildup, outlen, "%s%s", DIR_CHAR, tempdir);
      }
      /* Create directory. Ignore access denied error to allow traversal. */
      if(!skip && (-1 == mkdir(dirbuildup, (mode_t)0000750)) &&
         (errno != EACCES) && (errno != EEXIST)) {
        show_dir_errno(errors, dirbuildup);
        result = CURLE_WRITE_ERROR;
        break; /* get out of loop */
      }
    }
    tempdir = tempdir2;
  }

  Curl_safefree(dirbuildup);
  Curl_safefree(outdup);

  return result;
}